

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

void Ver_ParseReportUndefBoxes(Ver_Man_t *pMan)

{
  int iVar1;
  void **ppvVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  Abc_Des_t *pAVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  pVVar8 = pMan->pDesign->vModules;
  iVar1 = pVVar8->nSize;
  lVar6 = (long)iVar1;
  if (lVar6 < 1) {
    uVar9 = 0;
  }
  else {
    ppvVar2 = pVVar8->pArray;
    lVar10 = 0;
    uVar9 = 0;
    do {
      pvVar3 = ppvVar2[lVar10];
      *(undefined4 *)((long)pvVar3 + 0xc4) = 0;
      if (*(long *)((long)pvVar3 + 8) == 0) goto LAB_00350de8;
      if (*(int *)(*(long *)((long)pvVar3 + 0x28) + 4) == 0) {
        uVar9 = (ulong)((int)uVar9 + (uint)(*(int *)(*(long *)((long)pvVar3 + 0x30) + 4) == 0));
      }
      lVar10 = lVar10 + 1;
    } while (lVar6 != lVar10);
    if (0 < iVar1) {
      ppvVar2 = pVVar8->pArray;
      lVar10 = 0;
      do {
        lVar4 = *(long *)((long)ppvVar2[lVar10] + 0x50);
        lVar11 = (long)*(int *)(lVar4 + 4);
        if (0 < lVar11) {
          lVar4 = *(long *)(lVar4 + 8);
          lVar12 = 0;
          do {
            lVar5 = *(long *)(lVar4 + lVar12 * 8);
            if (((*(uint *)(lVar5 + 0x14) & 0xf) == 10) &&
               (lVar5 = *(long *)(lVar5 + 0x38), lVar5 != 0)) {
              if (*(long *)(lVar5 + 8) == 0) goto LAB_00350de8;
              if ((*(int *)(*(long *)(lVar5 + 0x28) + 4) == 0) &&
                 (*(int *)(*(long *)(lVar5 + 0x30) + 4) == 0)) {
                *(int *)(lVar5 + 0xc4) = *(int *)(lVar5 + 0xc4) + 1;
              }
            }
            lVar12 = lVar12 + 1;
          } while (lVar11 != lVar12);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar6);
    }
  }
  printf("Warning: The design contains %d undefined object types interpreted as blackboxes:\n",uVar9
        );
  pAVar7 = pMan->pDesign;
  pVVar8 = pAVar7->vModules;
  if (0 < pVVar8->nSize) {
    lVar6 = 0;
    do {
      pvVar3 = pVVar8->pArray[lVar6];
      if (*(long *)((long)pvVar3 + 8) == 0) {
LAB_00350de8:
        __assert_fail("pNtkBox->pName",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/ver/verCore.c"
                      ,0x4d,"int Ver_NtkIsDefined(Abc_Ntk_t *)");
      }
      if ((*(int *)(*(long *)((long)pvVar3 + 0x28) + 4) == 0) &&
         (*(int *)(*(long *)((long)pvVar3 + 0x30) + 4) == 0)) {
        printf("%s (%d)  ",*(long *)((long)pvVar3 + 8),(ulong)*(uint *)((long)pvVar3 + 0xc4));
        pAVar7 = pMan->pDesign;
      }
      lVar6 = lVar6 + 1;
      pVVar8 = pAVar7->vModules;
    } while (lVar6 < pVVar8->nSize);
  }
  putchar(10);
  pVVar8 = pMan->pDesign->vModules;
  lVar6 = (long)pVVar8->nSize;
  if (0 < lVar6) {
    ppvVar2 = pVVar8->pArray;
    lVar10 = 0;
    do {
      *(undefined4 *)((long)ppvVar2[lVar10] + 0xc4) = 0;
      lVar10 = lVar10 + 1;
    } while (lVar6 != lVar10);
  }
  return;
}

Assistant:

void Ver_ParseReportUndefBoxes( Ver_Man_t * pMan )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pBox;
    int i, k, nBoxes;
    // clean 
    nBoxes = 0;
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
    {
        pNtk->fHiePath = 0;
        if ( !Ver_NtkIsDefined(pNtk) )
            nBoxes++;
    }
    // count
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        Abc_NtkForEachBlackbox( pNtk, pBox, k )
            if ( pBox->pData && !Ver_NtkIsDefined((Abc_Ntk_t *)pBox->pData) )
                ((Abc_Ntk_t *)pBox->pData)->fHiePath++;
    // print the stats
    printf( "Warning: The design contains %d undefined object types interpreted as blackboxes:\n", nBoxes );
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        if ( !Ver_NtkIsDefined(pNtk) )
            printf( "%s (%d)  ", Abc_NtkName(pNtk), pNtk->fHiePath );
    printf( "\n" );
    // clean 
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
        pNtk->fHiePath = 0;
}